

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acl_nfs4.c
# Opt level: O0

void compare_acls(archive_entry *ae,acl_t *acls,int n,int mode)

{
  int iVar1;
  uint uVar2;
  archive_entry *entry;
  uint in_ECX;
  wchar_t in_EDX;
  char **in_RSI;
  archive_entry *in_RDI;
  char *name;
  int matched;
  int qual;
  int tag;
  int permset;
  int type;
  int r;
  int i;
  int *marker;
  undefined1 *extra;
  void *extra_00;
  int in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  wchar_t in_stack_ffffffffffffffb8;
  wchar_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  wchar_t in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  wchar_t wVar3;
  wchar_t local_14;
  
  entry = (archive_entry *)malloc((long)in_EDX << 2);
  for (wVar3 = L'\0'; local_14 = in_EDX, wVar3 < in_EDX; wVar3 = wVar3 + L'\x01') {
    *(wchar_t *)((long)&entry->archive + (long)wVar3 * 4) = wVar3;
  }
  while( true ) {
    extra = &stack0xffffffffffffffb8;
    wVar3 = archive_entry_acl_next
                      (entry,wVar3,
                       (wchar_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (wchar_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (wchar_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (wchar_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       in_RSI);
    if (wVar3 != L'\0') break;
    wVar3 = L'\0';
    in_stack_ffffffffffffffc4 = L'\0';
    while( true ) {
      uVar2 = in_stack_ffffffffffffffb4 & 0xffffff;
      if (wVar3 < local_14) {
        uVar2 = CONCAT13(in_stack_ffffffffffffffc4 != L'\0',(int3)in_stack_ffffffffffffffb4) ^
                0xff000000;
      }
      in_stack_ffffffffffffffb4 = uVar2;
      if ((in_stack_ffffffffffffffb4 & 0x1000000) == 0) break;
      iVar1 = acl_match((acl_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                        (int)((ulong)extra >> 0x20),(int)extra,(char *)0x122fa4);
      if (iVar1 != 0) {
        *(undefined4 *)((long)&entry->archive + (long)wVar3 * 4) =
             *(undefined4 *)((long)&entry->archive + (long)(local_14 + L'\xffffffff') * 4);
        local_14 = local_14 + L'\xffffffff';
        in_stack_ffffffffffffffc4 = L'\x01';
      }
      wVar3 = wVar3 + L'\x01';
    }
    if (in_stack_ffffffffffffffcc == 0x2712) {
      if (in_stack_ffffffffffffffc4 == L'\0') {
        printf("No match for user_obj perm\n");
      }
      failure("USER_OBJ permset (%02o) != user mode (%02o)",(ulong)in_stack_ffffffffffffffd0,
              (ulong)((int)in_ECX >> 6 & 7));
      assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                       (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),extra);
    }
    else if (in_stack_ffffffffffffffcc == 0x2714) {
      if (in_stack_ffffffffffffffc4 == L'\0') {
        printf("No match for group_obj perm\n");
      }
      failure("GROUP_OBJ permset %02o != group mode %02o",(ulong)in_stack_ffffffffffffffd0,
              (ulong)((int)in_ECX >> 3 & 7));
      assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                       (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),extra);
    }
    else if (in_stack_ffffffffffffffcc == 0x2716) {
      if (in_stack_ffffffffffffffc4 == L'\0') {
        printf("No match for other perm\n");
      }
      failure("OTHER permset (%02o) != other mode (%02o)",(ulong)in_stack_ffffffffffffffd0,
              (ulong)(in_ECX & 7));
      assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                       (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),extra);
    }
    else {
      failure("Could not find match for ACL (type=%d,permset=%d,tag=%d,qual=%d,name=``%s\'\')",
              (ulong)in_stack_ffffffffffffffd4,(ulong)in_stack_ffffffffffffffd0,
              (ulong)in_stack_ffffffffffffffcc,(ulong)in_stack_ffffffffffffffc8,
              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                       (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),extra);
    }
  }
  extra_00 = (void *)0x0;
  assertion_equal_int((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffc4,
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),0,
                      (char *)0x1231d3,entry);
  uVar2 = in_ECX & 0x1ff;
  archive_entry_mode(in_RDI);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                   (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar2),extra_00);
  failure("Could not find match for ACL (type=%d,permset=%d,tag=%d,qual=%d,name=``%s\'\')",
          (ulong)*(uint *)(in_RSI + (long)*(int *)&entry->archive * 3),
          (ulong)*(uint *)((long)in_RSI + (long)*(int *)&entry->archive * 0x18 + 4),
          (ulong)*(uint *)(in_RSI + (long)*(int *)&entry->archive * 3 + 1),
          (ulong)*(uint *)((long)in_RSI + (long)*(int *)&entry->archive * 0x18 + 0xc),
          in_RSI[(long)*(int *)&entry->archive * 3 + 2]);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                   (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar2),extra_00);
  free(entry);
  return;
}

Assistant:

static void
compare_acls(struct archive_entry *ae, struct acl_t *acls, int n)
{
	int *marker = malloc(sizeof(marker[0]) * n);
	int i;
	int r;
	int type, permset, tag, qual;
	int matched;
	const char *name;

	for (i = 0; i < n; i++)
		marker[i] = i;

	while (0 == (r = archive_entry_acl_next(ae,
			 ARCHIVE_ENTRY_ACL_TYPE_NFS4,
			 &type, &permset, &tag, &qual, &name))) {
		for (i = 0, matched = 0; i < n && !matched; i++) {
			if (acl_match(&acls[marker[i]], type, permset,
				tag, qual, name)) {
				/* We found a match; remove it. */
				marker[i] = marker[n - 1];
				n--;
				matched = 1;
			}
		}
		failure("Could not find match for ACL "
		    "(type=%d,permset=%d,tag=%d,qual=%d,name=``%s'')",
		    type, permset, tag, qual, name);
		assertEqualInt(1, matched);
	}
	assertEqualInt(ARCHIVE_EOF, r);
	failure("Could not find match for ACL "
	    "(type=%d,permset=%d,tag=%d,qual=%d,name=``%s'')",
	    acls[marker[0]].type, acls[marker[0]].permset,
	    acls[marker[0]].tag, acls[marker[0]].qual, acls[marker[0]].name);
	assertEqualInt(0, n); /* Number of ACLs not matched should == 0 */
	free(marker);
}